

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O0

void readcb(bufferevent *bev,void *ptr)

{
  int iVar1;
  undefined8 uVar2;
  http2_session_data *session_data_00;
  http2_session_data *session_data_01;
  ulong uVar3;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  uchar *data;
  size_t datalen;
  evbuffer *input;
  nghttp2_ssize readlen;
  http2_session_data *session_data;
  
  uVar2 = bufferevent_get_input(in_RDI);
  session_data_00 = (http2_session_data *)evbuffer_get_length(uVar2);
  session_data_01 = (http2_session_data *)evbuffer_pullup(uVar2,0xffffffffffffffff);
  uVar3 = nghttp2_session_mem_recv2(*in_RSI,session_data_01,session_data_00);
  if ((long)uVar3 < 0) {
    uVar2 = nghttp2_strerror(uVar3 & 0xffffffff);
    warnx("Fatal error: %s",uVar2);
    delete_http2_session_data(session_data_00);
  }
  else {
    iVar1 = evbuffer_drain(uVar2,uVar3);
    if (iVar1 == 0) {
      iVar1 = session_send(session_data_01);
      if (iVar1 != 0) {
        delete_http2_session_data(session_data_00);
      }
    }
    else {
      warnx("Fatal error: evbuffer_drain failed");
      delete_http2_session_data(session_data_00);
    }
  }
  return;
}

Assistant:

static void readcb(struct bufferevent *bev, void *ptr) {
  http2_session_data *session_data = (http2_session_data *)ptr;
  nghttp2_ssize readlen;
  struct evbuffer *input = bufferevent_get_input(bev);
  size_t datalen = evbuffer_get_length(input);
  unsigned char *data = evbuffer_pullup(input, -1);

  readlen = nghttp2_session_mem_recv2(session_data->session, data, datalen);
  if (readlen < 0) {
    warnx("Fatal error: %s", nghttp2_strerror((int)readlen));
    delete_http2_session_data(session_data);
    return;
  }
  if (evbuffer_drain(input, (size_t)readlen) != 0) {
    warnx("Fatal error: evbuffer_drain failed");
    delete_http2_session_data(session_data);
    return;
  }
  if (session_send(session_data) != 0) {
    delete_http2_session_data(session_data);
    return;
  }
}